

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::quantize
          (cbtAxisSweep3Internal<unsigned_int> *this,uint *out,cbtVector3 *point,int isMax)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 in_ZMM4 [64];
  undefined1 in_XMM5 [16];
  
  fVar1 = (point->m_floats[0] - (this->m_worldAabbMin).m_floats[0]) * (this->m_quantize).m_floats[0]
  ;
  fVar2 = (point->m_floats[1] - (this->m_worldAabbMin).m_floats[1]) * (this->m_quantize).m_floats[1]
  ;
  uVar4 = isMax;
  if (0.0 < fVar1) {
    uVar4 = this->m_handleSentinel;
    auVar3 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,uVar4);
    if (fVar1 < auVar3._0_4_) {
      uVar4 = vcvttss2usi_avx512f(ZEXT416((uint)fVar1));
    }
    uVar4 = uVar4 & this->m_bpHandleMask | isMax;
  }
  fVar1 = (point->m_floats[2] - (this->m_worldAabbMin).m_floats[2]) * (this->m_quantize).m_floats[2]
  ;
  *out = uVar4;
  uVar4 = isMax;
  if (0.0 < fVar2) {
    uVar4 = this->m_handleSentinel;
    auVar3 = vcvtusi2ss_avx512f(in_XMM5,uVar4);
    if (fVar2 < auVar3._0_4_) {
      uVar4 = vcvttss2usi_avx512f(ZEXT416((uint)fVar2));
    }
    uVar4 = uVar4 & this->m_bpHandleMask | isMax;
  }
  out[1] = uVar4;
  if (0.0 < fVar1) {
    uVar4 = this->m_handleSentinel;
    auVar3 = vcvtusi2ss_avx512f(in_XMM5,uVar4);
    if (fVar1 < auVar3._0_4_) {
      uVar4 = vcvttss2usi_avx512f(ZEXT416((uint)fVar1));
    }
    isMax = isMax | uVar4 & this->m_bpHandleMask;
  }
  out[2] = isMax;
  return;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3
operator-(const cbtVector3& v1, const cbtVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return cbtVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return cbtVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return cbtVector3(
		v1.m_floats[0] - v2.m_floats[0],
		v1.m_floats[1] - v2.m_floats[1],
		v1.m_floats[2] - v2.m_floats[2]);
#endif
}